

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossfactorstobin.cpp
# Opt level: O0

void lossfactorstobin::DoIt(void)

{
  int iVar1;
  char *pcVar2;
  uint local_1058;
  int lineno;
  char local_1048 [8];
  char line [4096];
  undefined4 local_3c;
  undefined1 local_38 [4];
  float factor;
  vector<amplification_factor,_std::allocator<amplification_factor>_> factors;
  amplification_factor af;
  event_amplification ea;
  int counter;
  int current_event_id;
  
  WriteOpts();
  ea.amplification_id = 0;
  ea.event_id = 0;
  std::vector<amplification_factor,_std::allocator<amplification_factor>_>::vector
            ((vector<amplification_factor,_std::allocator<amplification_factor>_> *)local_38);
  fgets(local_1048,0x1000,_stdin);
  local_1058 = 2;
  while( true ) {
    pcVar2 = fgets(local_1048,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      WriteCounterAmplitudesAndFactors
                (ea.event_id,
                 (vector<amplification_factor,_std::allocator<amplification_factor>_> *)local_38);
      std::vector<amplification_factor,_std::allocator<amplification_factor>_>::~vector
                ((vector<amplification_factor,_std::allocator<amplification_factor>_> *)local_38);
      return;
    }
    iVar1 = __isoc99_sscanf(local_1048,"%d,%d,%f",&af,&af.factor,&local_3c);
    if (iVar1 != 3) break;
    if (af.amplification_id != ea.amplification_id) {
      if (ea.amplification_id != 0) {
        WriteCounterAmplitudesAndFactors
                  (ea.event_id,
                   (vector<amplification_factor,_std::allocator<amplification_factor>_> *)local_38);
      }
      fwrite(&af,4,1,_stdout);
      ea.amplification_id = af.amplification_id;
      ea.event_id = 0;
      std::vector<amplification_factor,_std::allocator<amplification_factor>_>::clear
                ((vector<amplification_factor,_std::allocator<amplification_factor>_> *)local_38);
    }
    factors.super__Vector_base<amplification_factor,_std::allocator<amplification_factor>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = af.factor;
    factors.super__Vector_base<amplification_factor,_std::allocator<amplification_factor>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = local_3c;
    std::vector<amplification_factor,_std::allocator<amplification_factor>_>::push_back
              ((vector<amplification_factor,_std::allocator<amplification_factor>_> *)local_38,
               (value_type *)
               &factors.
                super__Vector_base<amplification_factor,_std::allocator<amplification_factor>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    ea.event_id = ea.event_id + 1;
    local_1058 = local_1058 + 1;
  }
  fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s\n",(ulong)local_1058,local_1048);
  exit(1);
}

Assistant:

void DoIt() {

    WriteOpts();

    int current_event_id = 0;
    int counter = 0;
    event_amplification ea;
    amplification_factor af;
    std::vector<amplification_factor> factors;
    float factor;
    char line[4096];

    fgets(line, sizeof(line), stdin);   // Skip header row
    int lineno = 2;

    while (fgets(line, sizeof(line), stdin) != 0) {

      if (sscanf(line, "%d,%d,%f", &ea.event_id, &ea.amplification_id,
		 &factor) != 3) {
	fprintf(stderr, "FATAL: Invalid data in line %d:\n%s\n", lineno, line);
	exit(EXIT_FAILURE);
      }

      if (ea.event_id != current_event_id) {
	if (current_event_id != 0) {
	  WriteCounterAmplitudesAndFactors(counter, factors);
	}
	fwrite(&ea.event_id, sizeof(ea.event_id), 1, stdout);
	current_event_id = ea.event_id;
	counter = 0;
	factors.clear();
      }

      af.amplification_id = ea.amplification_id;
      af.factor = factor;
      factors.push_back(af);
      ++counter;
      ++lineno;

    }

    WriteCounterAmplitudesAndFactors(counter, factors);

  }